

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O1

void __thiscall ncnn::Mat::substract_mean_normalize(Mat *this,float *mean_vals,float *norm_vals)

{
  int iVar1;
  int *piVar2;
  void *__ptr;
  long *plVar3;
  Layer *pLVar4;
  long lVar5;
  ParamDict pd;
  Option opt;
  Mat local_118;
  undefined1 local_d0 [8];
  ParamDict local_c8;
  Mat local_b8;
  void *local_70;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  int iStack_58;
  Allocator *local_50;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  int local_38;
  size_t local_30;
  
  if (norm_vals == (float *)0x0 && mean_vals != (float *)0x0) {
    pLVar4 = create_layer(3);
    ParamDict::ParamDict(&local_c8);
    ParamDict::set(&local_c8,0,this->c);
    (*pLVar4->_vptr_Layer[2])(pLVar4,&local_c8);
    local_b8.cstep = 0;
    local_b8.data = (void *)0x0;
    local_b8.refcount._0_4_ = 0;
    local_b8.refcount._4_4_ = 0;
    local_b8.elemsize._0_4_ = 0;
    local_b8.elemsize._4_4_ = 0;
    local_b8.elempack = 0;
    local_b8.allocator = (Allocator *)0x0;
    local_b8.dims = 0;
    local_b8.w = 0;
    local_b8.h = 0;
    local_b8.d = 0;
    local_b8.c = 0;
    local_118.cstep = 0;
    local_118.data = (void *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_118.elemsize._0_4_ = 0;
    local_118.elemsize._4_4_ = 0;
    local_118.elempack = 0;
    local_118.allocator = (Allocator *)0x0;
    local_118.dims = 0;
    local_118.w = 0;
    local_118.h = 0;
    local_118.d = 0;
    local_118.c = 0;
    create(&local_118,this->c,4,(Allocator *)0x0);
    piVar2 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_b8.allocator == (Allocator *)0x0) {
          if (local_b8.data != (void *)0x0) {
            free(local_b8.data);
          }
        }
        else {
          (*(local_b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    local_b8.data = local_118.data;
    local_b8.refcount._0_4_ = local_118.refcount._0_4_;
    local_b8.refcount._4_4_ = local_118.refcount._4_4_;
    local_b8.elemsize._0_4_ = (undefined4)local_118.elemsize;
    local_b8.elemsize._4_4_ = local_118.elemsize._4_4_;
    local_b8.elempack = local_118.elempack;
    local_b8.allocator = local_118.allocator;
    local_b8.dims = local_118.dims;
    local_b8.w = local_118.w;
    local_b8.h = local_118.h;
    local_b8.c = local_118.c;
    local_b8.d = local_118.d;
    local_b8.cstep = local_118.cstep;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_118.allocator == (Allocator *)0x0) {
          if (local_118.data != (void *)0x0) {
            free(local_118.data);
          }
        }
        else {
          (*(local_118.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_118.cstep = 0;
    local_118.data = (void *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_118.elemsize._0_4_ = 0;
    local_118.elemsize._4_4_ = 0;
    local_118.elempack = 0;
    local_118.dims = 0;
    local_118.w = 0;
    local_118.h = 0;
    local_118.d = 0;
    local_118.c = 0;
    iVar1 = this->c;
    if (0 < (long)iVar1) {
      lVar5 = 0;
      do {
        *(float *)((long)local_b8.data + lVar5 * 4) = -mean_vals[lVar5];
        lVar5 = lVar5 + 1;
      } while (iVar1 != lVar5);
    }
    ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_118,&local_b8);
    (*pLVar4->_vptr_Layer[3])(pLVar4,&local_118);
    ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_118);
    piVar2 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
    if (piVar2 == (int *)0x0) goto LAB_0016547b;
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 != 0) goto LAB_0016547b;
    if (local_b8.allocator != (Allocator *)0x0) {
      (*(local_b8.allocator)->_vptr_Allocator[3])();
      goto LAB_0016547b;
    }
  }
  else {
    if (mean_vals != (float *)0x0 || norm_vals == (float *)0x0) {
      if (mean_vals == (float *)0x0 || norm_vals == (float *)0x0) {
        return;
      }
      pLVar4 = create_layer(0x1d);
      ParamDict::ParamDict(&local_c8);
      ParamDict::set(&local_c8,0,this->c);
      ParamDict::set(&local_c8,1,1);
      (*pLVar4->_vptr_Layer[2])(pLVar4,&local_c8);
      lVar5 = 0x40;
      do {
        *(undefined8 *)((long)&local_b8.data + lVar5) = 0;
        *(undefined8 *)(local_d0 + lVar5 + -0x28) = 0;
        *(undefined8 *)(local_d0 + lVar5 + -0x20) = 0;
        *(undefined8 *)(local_d0 + lVar5 + -0x1c) = 0;
        *(undefined8 *)(local_d0 + lVar5 + -0x14) = 0;
        *(undefined8 *)(local_d0 + lVar5 + -8) = 0;
        *(undefined8 *)(local_d0 + lVar5) = 0;
        *(undefined8 *)(local_d0 + lVar5 + 4) = 0;
        *(undefined8 *)((long)&local_c8._vptr_ParamDict + lVar5 + 4) = 0;
        lVar5 = lVar5 + 0x48;
      } while (lVar5 != 0xd0);
      local_118.cstep = 0;
      local_118.data = (void *)0x0;
      local_118.refcount._0_4_ = 0;
      local_118.refcount._4_4_ = 0;
      local_118.elemsize._0_4_ = 0;
      local_118.elemsize._4_4_ = 0;
      local_118.elempack = 0;
      local_118.allocator = (Allocator *)0x0;
      local_118.dims = 0;
      local_118.w = 0;
      local_118.h = 0;
      local_118.d = 0;
      local_118.c = 0;
      create(&local_118,this->c,4,(Allocator *)0x0);
      piVar2 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_b8.allocator == (Allocator *)0x0) {
            if (local_b8.data != (void *)0x0) {
              free(local_b8.data);
            }
          }
          else {
            (*(local_b8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar2 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
      local_b8.data = local_118.data;
      local_b8.refcount._0_4_ = local_118.refcount._0_4_;
      local_b8.refcount._4_4_ = local_118.refcount._4_4_;
      local_b8.elemsize._0_4_ = (undefined4)local_118.elemsize;
      local_b8.elemsize._4_4_ = local_118.elemsize._4_4_;
      local_b8.elempack = local_118.elempack;
      local_b8.allocator = local_118.allocator;
      local_b8.dims = local_118.dims;
      local_b8.w = local_118.w;
      local_b8.h = local_118.h;
      local_b8.c = local_118.c;
      local_b8.d = local_118.d;
      local_b8.cstep = local_118.cstep;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_118.allocator == (Allocator *)0x0) {
            if (local_118.data != (void *)0x0) {
              free(local_118.data);
            }
          }
          else {
            (*(local_118.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_118.cstep = 0;
      local_118.data = (void *)0x0;
      local_118.refcount._0_4_ = 0;
      local_118.refcount._4_4_ = 0;
      local_118.elemsize._0_4_ = 0;
      local_118.elemsize._4_4_ = 0;
      local_118.elempack = 0;
      local_118.allocator = (Allocator *)0x0;
      local_118.dims = 0;
      local_118.w = 0;
      local_118.h = 0;
      local_118.d = 0;
      local_118.c = 0;
      create(&local_118,this->c,4,(Allocator *)0x0);
      piVar2 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = (int *)CONCAT44(uStack_64,uStack_68);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_50 == (Allocator *)0x0) {
            if (local_70 != (void *)0x0) {
              free(local_70);
            }
          }
          else {
            (*local_50->_vptr_Allocator[3])();
          }
        }
      }
      piVar2 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
      local_70 = local_118.data;
      uStack_68 = local_118.refcount._0_4_;
      uStack_64 = local_118.refcount._4_4_;
      uStack_60 = (undefined4)local_118.elemsize;
      uStack_5c = local_118.elemsize._4_4_;
      iStack_58 = local_118.elempack;
      local_50 = local_118.allocator;
      local_48 = local_118.dims;
      iStack_44 = local_118.w;
      iStack_40 = local_118.h;
      iStack_3c = local_118.d;
      local_38 = local_118.c;
      local_30 = local_118.cstep;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_118.allocator == (Allocator *)0x0) {
            if (local_118.data != (void *)0x0) {
              free(local_118.data);
            }
          }
          else {
            (*(local_118.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_118.cstep = 0;
      local_118.data = (void *)0x0;
      local_118.refcount._0_4_ = 0;
      local_118.refcount._4_4_ = 0;
      local_118.elemsize._0_4_ = 0;
      local_118.elemsize._4_4_ = 0;
      local_118.elempack = 0;
      local_118.dims = 0;
      local_118.w = 0;
      local_118.h = 0;
      local_118.d = 0;
      local_118.c = 0;
      iVar1 = this->c;
      if (0 < (long)iVar1) {
        lVar5 = 0;
        do {
          *(float *)((long)local_b8.data + lVar5 * 4) = norm_vals[lVar5];
          *(float *)((long)local_70 + lVar5 * 4) = -mean_vals[lVar5] * norm_vals[lVar5];
          lVar5 = lVar5 + 1;
        } while (iVar1 != lVar5);
      }
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_118,&local_b8);
      (*pLVar4->_vptr_Layer[3])(pLVar4,&local_118);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_118);
      lVar5 = 0x48;
      do {
        piVar2 = *(int **)((long)&local_b8.refcount + lVar5);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            __ptr = *(void **)((long)&local_b8.data + lVar5);
            plVar3 = *(long **)((long)&local_b8.allocator + lVar5);
            if (plVar3 == (long *)0x0) {
              if (__ptr != (void *)0x0) {
                free(__ptr);
              }
            }
            else {
              (**(code **)(*plVar3 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_b8.cstep + lVar5) = 0;
        *(undefined8 *)((long)&local_b8.refcount + lVar5 + 4) = 0;
        *(undefined8 *)((long)&local_b8.elemsize + lVar5 + 4) = 0;
        *(undefined8 *)((long)&local_b8.data + lVar5) = 0;
        *(undefined8 *)((long)&local_b8.refcount + lVar5) = 0;
        *(undefined8 *)((long)&local_b8.dims + lVar5) = 0;
        *(undefined8 *)((long)&local_b8.h + lVar5) = 0;
        *(undefined4 *)((long)&local_b8.c + lVar5) = 0;
        lVar5 = lVar5 + -0x48;
      } while (lVar5 != -0x48);
      goto LAB_0016547b;
    }
    pLVar4 = create_layer(0x1d);
    ParamDict::ParamDict(&local_c8);
    ParamDict::set(&local_c8,0,this->c);
    (*pLVar4->_vptr_Layer[2])(pLVar4,&local_c8);
    local_b8.cstep = 0;
    local_b8.data = (void *)0x0;
    local_b8.refcount._0_4_ = 0;
    local_b8.refcount._4_4_ = 0;
    local_b8.elemsize._0_4_ = 0;
    local_b8.elemsize._4_4_ = 0;
    local_b8.elempack = 0;
    local_b8.allocator = (Allocator *)0x0;
    local_b8.dims = 0;
    local_b8.w = 0;
    local_b8.h = 0;
    local_b8.d = 0;
    local_b8.c = 0;
    local_118.cstep = 0;
    local_118.data = (void *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_118.elemsize._0_4_ = 0;
    local_118.elemsize._4_4_ = 0;
    local_118.elempack = 0;
    local_118.allocator = (Allocator *)0x0;
    local_118.dims = 0;
    local_118.w = 0;
    local_118.h = 0;
    local_118.d = 0;
    local_118.c = 0;
    create(&local_118,this->c,4,(Allocator *)0x0);
    piVar2 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_b8.allocator == (Allocator *)0x0) {
          if (local_b8.data != (void *)0x0) {
            free(local_b8.data);
          }
        }
        else {
          (*(local_b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    local_b8.data = local_118.data;
    local_b8.refcount._0_4_ = local_118.refcount._0_4_;
    local_b8.refcount._4_4_ = local_118.refcount._4_4_;
    local_b8.elemsize._0_4_ = (undefined4)local_118.elemsize;
    local_b8.elemsize._4_4_ = local_118.elemsize._4_4_;
    local_b8.elempack = local_118.elempack;
    local_b8.allocator = local_118.allocator;
    local_b8.dims = local_118.dims;
    local_b8.w = local_118.w;
    local_b8.h = local_118.h;
    local_b8.c = local_118.c;
    local_b8.d = local_118.d;
    local_b8.cstep = local_118.cstep;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_118.allocator == (Allocator *)0x0) {
          if (local_118.data != (void *)0x0) {
            free(local_118.data);
          }
        }
        else {
          (*(local_118.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_118.cstep = 0;
    local_118.data = (void *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_118.elemsize._0_4_ = 0;
    local_118.elemsize._4_4_ = 0;
    local_118.elempack = 0;
    local_118.dims = 0;
    local_118.w = 0;
    local_118.h = 0;
    local_118.d = 0;
    local_118.c = 0;
    iVar1 = this->c;
    if (0 < (long)iVar1) {
      lVar5 = 0;
      do {
        *(float *)((long)local_b8.data + lVar5 * 4) = norm_vals[lVar5];
        lVar5 = lVar5 + 1;
      } while (iVar1 != lVar5);
    }
    ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_118,&local_b8);
    (*pLVar4->_vptr_Layer[3])(pLVar4,&local_118);
    ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_118);
    piVar2 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
    if (piVar2 == (int *)0x0) goto LAB_0016547b;
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 != 0) goto LAB_0016547b;
    if (local_b8.allocator != (Allocator *)0x0) {
      (*(local_b8.allocator)->_vptr_Allocator[3])();
      goto LAB_0016547b;
    }
  }
  if (local_b8.data != (void *)0x0) {
    free(local_b8.data);
  }
LAB_0016547b:
  ParamDict::~ParamDict(&local_c8);
  Option::Option((Option *)&local_b8);
  local_b8.data = (void *)CONCAT44(1,local_b8.data._0_4_);
  (*pLVar4->_vptr_Layer[4])(pLVar4,&local_b8);
  (*pLVar4->_vptr_Layer[9])(pLVar4,this,&local_b8);
  (*pLVar4->_vptr_Layer[5])(pLVar4,&local_b8);
  (*pLVar4->_vptr_Layer[1])(pLVar4);
  return;
}

Assistant:

void Mat::substract_mean_normalize(const float* mean_vals, const float* norm_vals)
{
    Layer* op;

    if (mean_vals && !norm_vals)
    {
        // substract mean only
        op = create_layer(LayerType::Bias);

        ParamDict pd;
        pd.set(0, c);

        op->load_param(pd);

        Mat weights[1];
        weights[0] = Mat(c);
        for (int q = 0; q < c; q++)
        {
            weights[0][q] = -mean_vals[q];
        }

        op->load_model(ModelBinFromMatArray(weights));
    }
    else if (!mean_vals && norm_vals)
    {
        // normalize only
        op = create_layer(LayerType::Scale);

        ParamDict pd;
        pd.set(0, c);

        op->load_param(pd);

        Mat weights[1];
        weights[0] = Mat(c);
        for (int q = 0; q < c; q++)
        {
            weights[0][q] = norm_vals[q];
        }

        op->load_model(ModelBinFromMatArray(weights));
    }
    else if (mean_vals && norm_vals)
    {
        // substract mean and normalize
        op = create_layer(LayerType::Scale);

        ParamDict pd;
        pd.set(0, c);
        pd.set(1, 1);

        op->load_param(pd);

        Mat weights[2];
        weights[0] = Mat(c);
        weights[1] = Mat(c);
        for (int q = 0; q < c; q++)
        {
            weights[0][q] = norm_vals[q];
            weights[1][q] = -mean_vals[q] * norm_vals[q];
        }

        op->load_model(ModelBinFromMatArray(weights));
    }
    else // if (!mean_vals && !norm_vals)
    {
        return;
    }

    Option opt;
    opt.num_threads = 1; // TODO

    op->create_pipeline(opt);

    op->forward_inplace(*this, opt);

    op->destroy_pipeline(opt);

    delete op;
}